

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.hpp
# Opt level: O2

MapStream<lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>,_lambda::Curried<std::plus<void>,_int>_>
* __thiscall
lambda::streams::Pipeable::
pipeable<lambda::streams::Range<std::vector<int,std::allocator<int>>>,lambda::streams::Map<lambda::Curried<std::plus<void>,int>>>
          (MapStream<lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>,_lambda::Curried<std::plus<void>,_int>_>
           *__return_storage_ptr__,Pipeable *this,
          Range<std::vector<int,_std::allocator<int>_>_> *arg,
          Map<lambda::Curried<std::plus<void>,_int>_> *pipeable)

{
  Range<std::vector<int,_std::allocator<int>_>_> local_38;
  
  local_38.range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)this;
  local_38.range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)(this + 8);
  local_38.range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)(this + 0x10);
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_38.begin_._M_current = *(int **)(this + 0x18);
  local_38.end_._M_current = *(int **)(this + 0x20);
  Map<lambda::Curried<std::plus<void>,int>>::
  pipe<lambda::streams::Range<std::vector<int,std::allocator<int>>>>
            (__return_storage_ptr__,arg,&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static auto pipeable(Arg &&arg, Pipeable pipeable) {
        return pipeable.pipe(std::forward<Arg>(arg));
    }